

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::attribute(xml_node *this,char_t *name_,xml_attribute *hint_)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xml_attribute_struct **ppxVar3;
  xml_attribute_struct *pxVar4;
  
  pxVar1 = hint_->_attr;
  if (pxVar1 != (xml_attribute_struct *)0x0) {
    if (this->_root != (xml_node_struct *)0x0) {
      ppxVar3 = &this->_root->first_attribute;
      do {
        pxVar4 = *ppxVar3;
        if (pxVar4 == pxVar1) break;
        ppxVar3 = &pxVar4->next_attribute;
      } while (pxVar4 != (xml_attribute_struct *)0x0);
      if (pxVar4 != (xml_attribute_struct *)0x0) goto LAB_0023ca4e;
    }
    __assert_fail("!hint || (_root && impl::is_attribute_of(hint, _root))",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1619,
                  "xml_attribute pugi::xml_node::attribute(const char_t *, xml_attribute &) const");
  }
LAB_0023ca4e:
  pxVar4 = pxVar1;
  if (this->_root != (xml_node_struct *)0x0) {
    for (; pxVar4 != (xml_attribute_struct *)0x0; pxVar4 = pxVar4->next_attribute) {
      if ((pxVar4->name != (char_t *)0x0) &&
         (bVar2 = impl::anon_unknown_0::strequal(name_,pxVar4->name), bVar2)) goto LAB_0023cabe;
    }
    pxVar4 = this->_root->first_attribute;
    if (pxVar4 != pxVar1 && pxVar4 != (xml_attribute_struct *)0x0) {
      while ((pxVar4->name == (char_t *)0x0 ||
             (bVar2 = impl::anon_unknown_0::strequal(name_,pxVar4->name), !bVar2))) {
        pxVar4 = pxVar4->next_attribute;
        if (pxVar4 == (xml_attribute_struct *)0x0) {
          return (xml_attribute)(xml_attribute_struct *)0x0;
        }
        if (pxVar4 == pxVar1) {
          return (xml_attribute)(xml_attribute_struct *)0x0;
        }
      }
LAB_0023cabe:
      hint_->_attr = pxVar4->next_attribute;
      return (xml_attribute)pxVar4;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_, xml_attribute& hint_) const
	{
		xml_attribute_struct* hint = hint_._attr;

		// if hint is not an attribute of node, behavior is not defined
		assert(!hint || (_root && impl::is_attribute_of(hint, _root)));

		if (!_root) return xml_attribute();

		// optimistically search from hint up until the end
		for (xml_attribute_struct* i = hint; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = i->next_attribute;

				return xml_attribute(i);
			}
		}

		// wrap around and search from the first attribute until the hint
		// 'j' null pointer check is technically redundant, but it prevents a crash in case the assertion above fails
		for (xml_attribute_struct* j = _root->first_attribute; j && j != hint; j = j->next_attribute)
		{
			const char_t* jname = j->name;
			if (jname && impl::strequal(name_, jname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = j->next_attribute;

				return xml_attribute(j);
			}
		}

		return xml_attribute();
	}